

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::RgbaInputFile::readPixels(RgbaInputFile *this,int scanLine1,int scanLine2)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  Lock lock;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  FromYca *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    InputFile::readPixels
              ((InputFile *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe8);
  }
  else {
    IlmThread_2_5::Lock::Lock
              ((Lock *)in_stack_ffffffffffffffe0,
               (Mutex *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (bool)in_stack_ffffffffffffffd7);
    FromYca::readPixels(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                        in_stack_ffffffffffffffd8);
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void	
RgbaInputFile::readPixels (int scanLine1, int scanLine2)
{
    if (_fromYca)
    {
	Lock lock (*_fromYca);
	_fromYca->readPixels (scanLine1, scanLine2);
    }
    else
    {
	_inputFile->readPixels (scanLine1, scanLine2);
    }
}